

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

iterator __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
::allocate(basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
           *this,value_type *v)

{
  iterator this_00;
  
  this_00 = (iterator)operator_new(0x68);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
  ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
          *)this_00,v);
  this_00->next = (container *)0x0;
  this_00->prev = (container *)0x0;
  return this_00;
}

Assistant:

iterator allocate(value_type const &v)
	{
		container_alloc al;
		iterator p = al.allocate(1);
		try {
			new (p) container(v);
		}
		catch(...) {
			al.deallocate(p,1);
			throw;
		}
		return p;
	}